

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RsCaseSyntax *pRVar1;
  ExpressionSyntax *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  ExpressionSyntax *in_stack_ffffffffffffff90;
  
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5de20);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  deepClone<slang::syntax::RsCaseItemSyntax>(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsCaseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::RsCaseItemSyntax>&,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,(SyntaxList<slang::syntax::RsCaseItemSyntax> *)__child_stack,
                      in_stack_00000030);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsCaseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsCaseSyntax>(
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endcase.deepClone(alloc)
    );
}